

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readRequestAllowingConnect(HttpInputStreamImpl *this)

{
  long lVar1;
  bool bVar2;
  byte extraout_AL;
  Tag TVar3;
  undefined8 *puVar4;
  Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *this_00;
  Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *promise;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  *pOVar5;
  Request *other;
  ConnectRequest *pCVar6;
  Own<kj::AsyncInputStream,_std::nullptr_t> *pOVar7;
  OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
  *__return_storage_ptr__;
  PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___00;
  HttpInputStreamImpl *this_01;
  undefined8 *puVar8;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *this_02;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *value;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *this_03;
  OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *value_00;
  undefined8 in_RSI;
  void *pvVar9;
  void *in_stack_fffffffffffff830;
  int local_778;
  int local_764;
  int local_748;
  Fault local_638;
  Fault f;
  ProtocolError *_kj_switch_done_2;
  ProtocolError *error;
  size_t local_618;
  HttpHeaders *local_610;
  Own<kj::AsyncInputStream,_std::nullptr_t> aOStack_608 [4];
  HttpConnectMethod local_5b9 [17];
  undefined1 local_5a8 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> body_1;
  ConnectRequest *_kj_switch_done_1;
  ConnectRequest *request_1;
  ArrayDisposer *local_580;
  size_t local_578;
  HttpHeaders *local_570;
  Own<kj::AsyncInputStream,_std::nullptr_t> aOStack_568 [5];
  undefined1 local_510 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> body;
  Request *_kj_switch_done;
  Request *request;
  HttpInputStreamImpl *this_local;
  
  puVar4 = (undefined8 *)operator_new(0x578);
  *puVar4 = readRequestAllowingConnect;
  puVar4[1] = readRequestAllowingConnect;
  __return_storage_ptr__ =
       (OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
        *)(puVar4 + 0x8d);
  __return_storage_ptr___00 =
       (PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
        *)(puVar4 + 0x4e);
  this_01 = (HttpInputStreamImpl *)(puVar4 + 0xab);
  puVar8 = puVar4 + 0xac;
  this_02 = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar4 + 0xa6);
  value = (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)(puVar4 + 0x95);
  this_03 = (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)(puVar4 + 0xa8);
  value_00 = (OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect> *)(puVar4 + 0x9c);
  this_00 = (Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_> *)
            (puVar4 + 2);
  puVar4[0xad] = in_RSI;
  SourceLocation::SourceLocation
            ((SourceLocation *)(puVar4 + 0xa3),
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"readRequestAllowingConnect",0x593);
  pvVar9 = (void *)puVar4[0xa5];
  kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
  Coroutine(this_00,*(SourceLocation *)(puVar4 + 0xa3));
  kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
  get_return_object((Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
                     *)this);
  kj::_::CoroutineBase::initial_suspend((CoroutineBase *)this_00);
  bVar2 = std::__n4861::suspend_never::await_ready((suspend_never *)((long)puVar4 + 0x575));
  if (bVar2) {
    std::__n4861::suspend_never::await_resume((suspend_never *)((long)puVar4 + 0x575));
    readRequestHeaders(this_01);
    promise = kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>
              ::
              await_transform<kj::Promise<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>>
                        ((Coroutine<kj::OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>>
                          *)this_00,
                         (Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                          *)this_01);
    co_await<kj::OneOf<kj::HttpHeaders::Request,kj::HttpHeaders::ConnectRequest,kj::HttpHeaders::ProtocolError>>
              (__return_storage_ptr___00,promise);
    bVar2 = kj::_::PromiseAwaiterBase::await_ready((PromiseAwaiterBase *)__return_storage_ptr___00);
    if (!bVar2) {
      *(undefined1 *)((long)puVar4 + 0x574) = 1;
      _GLOBAL__N_1::HttpInputStreamImpl::readRequestAllowingConnect
                (in_stack_fffffffffffff830,pvVar9);
      if ((extraout_AL & 1) != 0) {
        return (PromiseBase)(PromiseBase)this;
      }
    }
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::await_resume(__return_storage_ptr__,__return_storage_ptr___00);
    kj::_::
    PromiseAwaiter<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~PromiseAwaiter(__return_storage_ptr___00);
    Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
    ::~Promise((Promise<kj::OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>_>
                *)this_01);
    pOVar5 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
             ::_switchSubject(__return_storage_ptr__);
    *puVar8 = pOVar5;
    TVar3 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
            ::which((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                     *)*puVar8);
    if (TVar3 == _variant0) {
      other = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
              ::get<kj::HttpHeaders::Request>
                        ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                          *)*puVar8);
      body.ptr = (AsyncInputStream *)other;
      if (other == (Request *)0x0) {
        local_748 = 5;
      }
      else {
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpMethod&,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)this_02,&other->method);
        getEntityBody((HttpInputStreamImpl *)local_510,(RequestOrResponse)puVar4[0xad],
                      (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)this_02,
                      (HttpHeaders *)0x0);
        lVar1 = puVar4[0xad];
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(this_02);
        request_1._0_4_ = other->method;
        local_580 = (ArrayDisposer *)(other->url).content.ptr;
        local_578 = (other->url).content.size_;
        local_570 = (HttpHeaders *)(lVar1 + 0x48);
        pOVar7 = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                           ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_510);
        Own<kj::AsyncInputStream,_std::nullptr_t>::Own(aOStack_568,pOVar7);
        OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>::
        OneOf<kj::HttpInputStream::Request,int>
                  ((OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect> *)value,
                   (Request *)&request_1);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>,_kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>,_kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
                        *)this_00,value);
        OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::~OneOf(value);
        HttpInputStream::Request::~Request((Request *)&request_1);
        Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
                  ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_510);
        local_748 = 3;
      }
      if (local_748 == 5) {
        local_764 = 4;
      }
      else {
        local_764 = local_748;
      }
    }
    else if (TVar3 == _variant1) {
      pCVar6 = OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
               ::get<kj::HttpHeaders::ConnectRequest>
                         ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                           *)*puVar8);
      body_1.ptr = (AsyncInputStream *)pCVar6;
      if (pCVar6 == (ConnectRequest *)0x0) {
        local_778 = 8;
      }
      else {
        OneOf<kj::HttpMethod,kj::HttpConnectMethod>::OneOf<kj::HttpConnectMethod,int>
                  ((OneOf<kj::HttpMethod,kj::HttpConnectMethod> *)this_03,local_5b9);
        getEntityBody((HttpInputStreamImpl *)local_5a8,(RequestOrResponse)puVar4[0xad],
                      (OneOf<kj::HttpMethod,_kj::HttpConnectMethod> *)0x0,(uint)this_03,
                      (HttpHeaders *)0x0);
        lVar1 = puVar4[0xad];
        OneOf<kj::HttpMethod,_kj::HttpConnectMethod>::~OneOf(this_03);
        error = (ProtocolError *)(pCVar6->authority).content.ptr;
        local_618 = (pCVar6->authority).content.size_;
        local_610 = (HttpHeaders *)(lVar1 + 0x48);
        pOVar7 = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                           ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_5a8);
        Own<kj::AsyncInputStream,_std::nullptr_t>::Own(aOStack_608,pOVar7);
        OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect>::
        OneOf<kj::HttpInputStream::Connect,int>
                  ((OneOf<kj::HttpInputStream::Request,kj::HttpInputStream::Connect> *)value_00,
                   (Connect *)&error);
        kj::_::
        CoroutineMixin<kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>,_kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
        ::return_value((CoroutineMixin<kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>,_kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>
                        *)this_00,value_00);
        OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>::~OneOf(value_00);
        HttpInputStream::Connect::~Connect((Connect *)&error);
        Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
                  ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_5a8);
        local_778 = 3;
      }
      if (local_778 == 8) {
        local_764 = 4;
      }
      else {
        local_764 = local_778;
      }
    }
    else {
      if (TVar3 == _variant2) {
        f.exception = (Exception *)
                      OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                      ::get<kj::HttpHeaders::ProtocolError>
                                ((OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
                                  *)*puVar8);
        if (f.exception != (Exception *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
                    (&local_638,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x59f,FAILED,(char *)0x0,"\"bad request\"",(char (*) [12])"bad request");
          kj::_::Debug::Fault::fatal(&local_638);
        }
        f.exception = (Exception *)0x0;
      }
      local_764 = 0;
    }
    if ((local_764 == 0) || (local_764 == 4)) {
      kj::_::unreachable();
    }
    OneOf<kj::HttpHeaders::Request,_kj::HttpHeaders::ConnectRequest,_kj::HttpHeaders::ProtocolError>
    ::~OneOf(__return_storage_ptr__);
    if (local_764 == 3) {
      kj::_::CoroutineBase::final_suspend((CoroutineBase *)this_00);
      bVar2 = std::__n4861::suspend_always::await_ready((suspend_always *)((long)puVar4 + 0x576));
      if (!bVar2) {
        *puVar4 = 0;
        *(undefined1 *)((long)puVar4 + 0x574) = 2;
        _GLOBAL__N_1::HttpInputStreamImpl::readRequestAllowingConnect
                  (in_stack_fffffffffffff830,pvVar9);
        return (PromiseBase)(PromiseBase)this;
      }
      std::__n4861::suspend_always::await_resume((suspend_always *)((long)puVar4 + 0x576));
    }
    kj::_::Coroutine<kj::OneOf<kj::HttpInputStream::Request,_kj::HttpInputStream::Connect>_>::
    ~Coroutine(this_00);
    if (puVar4 != (undefined8 *)0x0) {
      operator_delete(puVar4,0x578);
    }
  }
  else {
    *(undefined1 *)((long)puVar4 + 0x574) = 0;
    _GLOBAL__N_1::HttpInputStreamImpl::readRequestAllowingConnect(in_stack_fffffffffffff830,pvVar9);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::OneOf<Request, Connect>> readRequestAllowingConnect() override {
    auto requestOrProtocolError = co_await readRequestHeaders();
    KJ_SWITCH_ONEOF(requestOrProtocolError) {
      KJ_CASE_ONEOF(request, HttpHeaders::Request) {
        auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);
        co_return HttpInputStream::Request { request.method, request.url, headers, kj::mv(body) };
      }
      KJ_CASE_ONEOF(request, HttpHeaders::ConnectRequest) {
        auto body = getEntityBody(HttpInputStreamImpl::REQUEST, HttpConnectMethod(), 0, headers);
        co_return HttpInputStream::Connect { request.authority, headers, kj::mv(body) };
      }
      KJ_CASE_ONEOF(error, HttpHeaders::ProtocolError) {
        KJ_FAIL_REQUIRE("bad request");
      }
    }
    KJ_UNREACHABLE;
  }